

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O0

TPZAutoPointer<TPZMatrix<std::complex<float>_>_> __thiscall
TPZSTShiftOrigin<std::complex<float>_>::CalcMatrix
          (TPZSTShiftOrigin<std::complex<float>_> *this,
          TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *A,
          TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *B)

{
  int iVar1;
  TPZMatrix<std::complex<float>_> *pTVar2;
  TPZBaseMatrix *this_00;
  long lVar3;
  TPZMatrix<std::complex<float>_> *pTVar4;
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *in_RCX;
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *in_RDX;
  TPZSTShiftOrigin<std::complex<float>_> *in_RSI;
  TPZReference *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int i;
  int64_t nRows;
  complex<float> *shift;
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *shiftedMat;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined1 local_58 [8];
  int local_50;
  long local_40;
  undefined1 local_38 [8];
  undefined1 *local_30;
  undefined1 local_21;
  
  pTVar2 = TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->(in_RCX);
  iVar1 = (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  if (iVar1 == 0) {
    pTVar2 = TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->(in_RCX);
    (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x17])();
  }
  else {
    pTVar2 = TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->(in_RCX);
    (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1b])();
  }
  local_21 = 0;
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  Shift(in_RSI);
  local_30 = local_38;
  this_00 = &TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->(in_RDX)->
             super_TPZBaseMatrix;
  local_40 = TPZBaseMatrix::Rows(this_00);
  for (local_50 = 0; local_50 < local_40; local_50 = local_50 + 1) {
    pTVar2 = TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)in_RDI);
    lVar3 = (long)local_50;
    pTVar4 = TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)in_RDI);
    (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(pTVar4,(long)local_50);
    std::operator-((complex<float> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   (complex<float> *)0x11b8f55);
    in_stack_ffffffffffffff28 = extraout_XMM0_Da;
    in_stack_ffffffffffffff2c = extraout_XMM0_Db;
    (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
              (pTVar2,lVar3,lVar3,local_58);
  }
  return (TPZAutoPointer<TPZMatrix<std::complex<float>_>_>)in_RDI;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  if (B->IsSymmetric()) B->Decompose_LDLt();
  else B->Decompose_LU();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //b-1 * shiftedA will be computed at the arnoldi iteration
  const auto &shift = Shift();
  const auto nRows = A->Rows();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}